

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SensorManager.cpp
# Opt level: O2

void __thiscall sf::priv::SensorManager::SensorManager(SensorManager *this)

{
  SensorImpl SVar1;
  long lVar2;
  int __oflag;
  SensorImpl *this_00;
  int i;
  ulong uVar3;
  
  lVar2 = 0xc;
  do {
    *(undefined8 *)((long)this->m_sensors + lVar2 + -8) = 0;
    *(undefined4 *)(&this->m_sensors[0].available + lVar2) = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x6c);
  SensorImpl::initialize();
  this_00 = (SensorImpl *)&this->m_sensors[0].field_0x2;
  for (uVar3 = 0; uVar3 != 6; uVar3 = uVar3 + 1) {
    SVar1 = (SensorImpl)SensorImpl::isAvailable((Type)uVar3);
    this_00[-2] = SVar1;
    if ((bool)SVar1) {
      SensorImpl::open(this_00,(char *)(uVar3 & 0xffffffff),__oflag);
      SensorImpl::setEnabled(this_00,false);
    }
    this_00 = this_00 + 0x10;
  }
  return;
}

Assistant:

SensorManager::SensorManager()
{
    // Global sensor initialization
    SensorImpl::initialize();

    // Per sensor initialization
    for (int i = 0; i < Sensor::Count; ++i)
    {
        // Check which sensors are available
        m_sensors[i].available = SensorImpl::isAvailable(static_cast<Sensor::Type>(i));

        // Open the available sensors
        if (m_sensors[i].available)
        {
            m_sensors[i].sensor.open(static_cast<Sensor::Type>(i));
            m_sensors[i].sensor.setEnabled(false);
        }
    }
}